

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

real_t tinyobj::parseReal(char **token,double default_value)

{
  long lVar1;
  size_t sVar2;
  char *pcStack_28;
  real_t f;
  double val;
  char *end;
  double default_value_local;
  char **token_local;
  
  end = (char *)default_value;
  default_value_local = (double)token;
  sVar2 = strspn(*token," \t");
  *(size_t *)default_value_local = sVar2 + *(long *)default_value_local;
  lVar1 = *(long *)default_value_local;
  sVar2 = strcspn(*(char **)default_value_local," \t\r");
  val = (double)(lVar1 + sVar2);
  pcStack_28 = end;
  tryParseDouble(*(char **)default_value_local,(char *)val,(double *)&stack0xffffffffffffffd8);
  *(double *)default_value_local = val;
  return (float)(double)pcStack_28;
}

Assistant:

static inline real_t parseReal(const char **token, double default_value = 0.0) {
  (*token) += strspn((*token), " \t");
  const char *end = (*token) + strcspn((*token), " \t\r");
  double val = default_value;
  tryParseDouble((*token), end, &val);
  real_t f = static_cast<real_t>(val);
  (*token) = end;
  return f;
}